

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

HMBool hypermind::addEntry(Entry *entries,HMUINT32 capacity,Value key,Value value)

{
  float fVar1;
  HMObject *pHVar2;
  HMBool HVar3;
  uint uVar4;
  ValueType VVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  anon_union_8_3_be54641b_for_Value_1 aVar9;
  ValueType VVar10;
  Entry *pEVar11;
  
  aVar9 = key.field_1;
  VVar10 = key.type;
  uVar7 = (ulong)aVar9.objval & 0xffffffff;
  if (VVar10 == Object) {
    uVar4 = (**(aVar9.objval)->_vptr_HMObject)(aVar9.objval);
    uVar7 = (ulong)uVar4;
  }
  uVar7 = uVar7 % (ulong)capacity;
  pEVar11 = entries + uVar7;
  VVar5 = entries[uVar7].key.type;
  if (VVar5 != Undefined) {
    fVar8 = key.field_1._0_4_;
    do {
      if (VVar5 == VVar10) {
        switch(VVar10) {
        case Null:
        case True:
        case False:
switchD_00113667_caseD_1:
          HVar3 = false;
          goto LAB_001136cd;
        case Integer:
          if ((float)(pEVar11->key).field_1.intval == fVar8) goto switchD_00113667_caseD_1;
          break;
        case Float:
          fVar1 = (pEVar11->key).field_1.floatval;
          if ((fVar1 == fVar8) && (!NAN(fVar1) && !NAN(fVar8))) goto switchD_00113667_caseD_1;
          break;
        case Object:
          pHVar2 = (pEVar11->key).field_1.objval;
          if ((pHVar2 == aVar9.objval) ||
             (iVar6 = (*pHVar2->_vptr_HMObject[3])(), (char)iVar6 != '\0'))
          goto switchD_00113667_caseD_1;
        }
      }
      uVar4 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar4;
      if (uVar4 == capacity) {
        uVar7 = 0;
      }
      pEVar11 = entries + uVar7;
      VVar5 = entries[uVar7].key.type;
    } while (VVar5 != Undefined);
  }
  (pEVar11->key).type = VVar10;
  (pEVar11->key).field_1.objval = (HMObject *)aVar9;
  HVar3 = true;
LAB_001136cd:
  (pEVar11->value).type = value.type;
  (pEVar11->value).field_1 = value.field_1;
  return HVar3;
}

Assistant:

HMBool addEntry(Entry *entries, HMUINT32 capacity, Value key, Value value) {
        uint32_t index = key.hash() % capacity;
        while (true) {
            if (entries[index].key.type == ValueType::Undefined) {
                entries[index].key = key;
                entries[index].value = value;
                return true;       //新的key就返回true
            } else if (entries[index].key.equals(key)) { //key已经存在,仅仅更新值就行
                entries[index].value = value;
                return false;    // 未增加新的key就返回false
            }
            //开放探测定址,尝试下一个slot
            index = (index + 1) % capacity;
        }

    }